

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChIterativeSolver.cpp
# Opt level: O2

void __thiscall
chrono::ChIterativeSolver::SaveMatrix(ChIterativeSolver *this,ChSystemDescriptor *sysd)

{
  Scalar *pSVar1;
  int i;
  long index;
  ChVectorDynamic<> rhs2;
  ChVectorDynamic<> rhs1;
  ChVectorDynamic<> v;
  ChVectorDynamic<> e;
  ChMatrixDynamic<> Z2;
  Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_> local_3b0;
  ChSparseMatrix Z1;
  ChStreamOutAsciiFile file;
  
  Eigen::SparseMatrix<double,_1,_int>::SparseMatrix(&Z1);
  (*sysd->_vptr_ChSystemDescriptor[0x1c])(sysd,&Z1,0);
  file.super_ChStreamFile._vptr_ChStreamFile = (_func_int **)Z1.m_outerSize;
  local_3b0.
  super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
  .
  super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
  .m_data = (PointerType)Z1.m_innerSize;
  Eigen::Matrix<double,-1,-1,1,-1,-1>::Matrix<long,long>
            ((Matrix<double,_1,_1,1,_1,_1> *)&Z2,(long *)&file,(long *)&local_3b0);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::Zero
            ((ConstantReturnType *)&file,Z1.m_innerSize);
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
  PlainObjectBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&e,
             (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
              *)&file);
  file.super_ChStreamFile._vptr_ChStreamFile = (_func_int **)Z1.m_innerSize;
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<long>(&v,(long *)&file);
  for (index = 0; index < Z1.m_innerSize; index = index + 1) {
    pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&e,index);
    *pSVar1 = 1.0;
    (*sysd->_vptr_ChSystemDescriptor[0x17])
              (sysd,&v,(DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&e);
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_-1,_1,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,__1,_1,_false> *)&file,&Z2,index);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,_1,1,false>,Eigen::Matrix<double,_1,1,0,_1,1>>
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,__1,_1,_false> *)&file,&v);
    pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&e,index);
    *pSVar1 = 0.0;
  }
  ChStreamOutAsciiFile::ChStreamOutAsciiFile(&file,"Z1.dat",_S_trunc);
  ChStreamOutAscii::SetNumFormat(&file.super_ChStreamOutAscii,"%.12g");
  StreamOUTsparseMatlabFormat(&Z1,&file.super_ChStreamOutAscii);
  ChStreamOutAsciiFile::~ChStreamOutAsciiFile(&file);
  ChStreamOutAsciiFile::ChStreamOutAsciiFile(&file,"Z2.dat",_S_trunc);
  ChStreamOutAscii::SetNumFormat(&file.super_ChStreamOutAscii,"%.12g");
  Eigen::Ref<Eigen::Matrix<double,-1,-1,1,-1,-1>const,0,Eigen::OuterStride<-1>>::
  Ref<Eigen::Matrix<double,_1,_1,1,_1,_1>>
            ((Ref<Eigen::Matrix<double,_1,_1,1,_1,_1>const,0,Eigen::OuterStride<_1>> *)&local_3b0,
             (DenseBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_> *)&Z2,(type *)0x0);
  StreamOUTdenseMatlabFormat(&local_3b0,&file.super_ChStreamOutAscii);
  Eigen::internal::handmade_aligned_free
            (local_3b0.m_object.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
             m_storage.m_data);
  ChStreamOutAsciiFile::~ChStreamOutAsciiFile(&file);
  rhs1.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)0x0;
  rhs1.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0;
  (*sysd->_vptr_ChSystemDescriptor[0x1c])(sysd,0);
  rhs2.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)0x0;
  rhs2.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0;
  (*sysd->_vptr_ChSystemDescriptor[0xe])(sysd);
  ChStreamOutAsciiFile::ChStreamOutAsciiFile(&file,"rhs1.dat",_S_trunc);
  ChStreamOutAscii::SetNumFormat(&file.super_ChStreamOutAscii,"%.12g");
  Eigen::Ref<Eigen::Matrix<double,-1,-1,1,-1,-1>const,0,Eigen::OuterStride<-1>>::
  Ref<Eigen::Matrix<double,_1,1,0,_1,1>>
            ((Ref<Eigen::Matrix<double,_1,_1,1,_1,_1>const,0,Eigen::OuterStride<_1>> *)&local_3b0,
             (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&rhs1,(type *)0x0);
  StreamOUTdenseMatlabFormat(&local_3b0,&file.super_ChStreamOutAscii);
  Eigen::internal::handmade_aligned_free
            (local_3b0.m_object.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
             m_storage.m_data);
  ChStreamOutAsciiFile::~ChStreamOutAsciiFile(&file);
  ChStreamOutAsciiFile::ChStreamOutAsciiFile(&file,"rhs2.dat",_S_trunc);
  ChStreamOutAscii::SetNumFormat(&file.super_ChStreamOutAscii,"%.12g");
  Eigen::Ref<Eigen::Matrix<double,-1,-1,1,-1,-1>const,0,Eigen::OuterStride<-1>>::
  Ref<Eigen::Matrix<double,_1,1,0,_1,1>>
            ((Ref<Eigen::Matrix<double,_1,_1,1,_1,_1>const,0,Eigen::OuterStride<_1>> *)&local_3b0,
             (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&rhs2,(type *)0x0);
  StreamOUTdenseMatlabFormat(&local_3b0,&file.super_ChStreamOutAscii);
  Eigen::internal::handmade_aligned_free
            (local_3b0.m_object.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
             m_storage.m_data);
  ChStreamOutAsciiFile::~ChStreamOutAsciiFile(&file);
  Eigen::internal::handmade_aligned_free
            (rhs2.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
  Eigen::internal::handmade_aligned_free
            (rhs1.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
  Eigen::internal::handmade_aligned_free
            (v.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
  Eigen::internal::handmade_aligned_free
            (e.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
  Eigen::internal::handmade_aligned_free
            (Z2.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_data);
  Eigen::SparseMatrix<double,_1,_int>::~SparseMatrix(&Z1);
  return;
}

Assistant:

void ChIterativeSolver::SaveMatrix(ChSystemDescriptor& sysd) {
    // Assemble sparse matrix
    ChSparseMatrix Z1;
    sysd.ConvertToMatrixForm(&Z1, nullptr);

    // Create sparse matrix with SPMV
    ChMatrixDynamic<> Z2(Z1.rows(), Z1.cols());
    ChVectorDynamic<> e = ChVectorDynamic<>::Zero(Z1.cols());
    ChVectorDynamic<> v(Z1.cols());
    for (int i = 0; i < Z1.cols(); i++) {
        e(i) = 1;
        sysd.SystemProduct(v, e);
        Z2.col(i) = v;
        e(i) = 0;
    }

    // Save matrices to file
    {
        ChStreamOutAsciiFile file("Z1.dat");
        file.SetNumFormat("%.12g");
        StreamOUTsparseMatlabFormat(Z1, file);
    }
    {
        ChStreamOutAsciiFile file("Z2.dat");
        file.SetNumFormat("%.12g");
        StreamOUTdenseMatlabFormat(Z2, file);
    }

    // Assemble RHS
    ChVectorDynamic<> rhs1;
    sysd.ConvertToMatrixForm(nullptr, &rhs1);

    // RHS using d vector
    ChVectorDynamic<> rhs2;
    sysd.BuildDiVector(rhs2);

    // Save vectors to file
    {
        ChStreamOutAsciiFile file("rhs1.dat");
        file.SetNumFormat("%.12g");
        StreamOUTdenseMatlabFormat(rhs1, file);
    }
    {
        ChStreamOutAsciiFile file("rhs2.dat");
        file.SetNumFormat("%.12g");
        StreamOUTdenseMatlabFormat(rhs2, file);
    }
}